

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printOriginalExpression(AssertionPrinter *this)

{
  bool bVar1;
  undefined8 *in_RDI;
  AssertionResult *in_stack_00000018;
  Colour colourGuard;
  Code in_stack_ffffffffffffffac;
  Colour *in_stack_ffffffffffffffb0;
  ostream *poVar2;
  string local_40 [64];
  
  bVar1 = AssertionResult::hasExpression((AssertionResult *)0x1ddadc);
  if (bVar1) {
    Colour::Colour(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    std::operator<<((ostream *)*in_RDI,"  ");
    poVar2 = (ostream *)*in_RDI;
    AssertionResult::getExpressionInMacro_abi_cxx11_(in_stack_00000018);
    std::operator<<(poVar2,local_40);
    std::__cxx11::string::~string(local_40);
    std::operator<<((ostream *)*in_RDI,"\n");
    Colour::~Colour((Colour *)0x1ddb62);
  }
  return;
}

Assistant:

void printOriginalExpression() const {
                if( result.hasExpression() ) {
                    Colour colourGuard( Colour::OriginalExpression );
                    stream  << "  ";
                    stream << result.getExpressionInMacro();
                    stream << "\n";
                }
            }